

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O0

ParseOutput __thiscall
helics::helicsCLI11App::helics_parse<int&,char**&>(helicsCLI11App *this,int *args,char ***args_1)

{
  Option *this_00;
  size_t sVar1;
  char (*__args) [9];
  long in_RDI;
  CallForHelp *ch;
  CallForAllHelp *ca;
  CallForVersion *cv;
  Success *anon_var_0;
  Error *ce;
  Option *opt;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  App *in_stack_ffffffffffffff20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff30;
  App *in_stack_ffffffffffffff48;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator<char> local_69 [9];
  string *in_stack_ffffffffffffffa0;
  App *in_stack_ffffffffffffffa8;
  
  CLI::App::parse(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(char **)0x20a486);
  *(undefined4 *)(in_RDI + 0x364) = 0;
  CLI::App::remaining_for_passthrough_abi_cxx11_
            (in_stack_ffffffffffffff48,SUB81((ulong)in_RDI >> 0x38,0));
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffff30);
  if ((*(byte *)(in_RDI + 0x361) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    this_00 = CLI::App::get_option_no_throw(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff20);
    std::allocator<char>::~allocator(local_69);
    if ((this_00 != (Option *)0x0) && (sVar1 = CLI::Option::count((Option *)0x20a561), sVar1 != 0))
    {
      __args = (char (*) [9])(in_RDI + 0x380);
      CLI::Option::as<std::__cxx11::string>((Option *)in_stack_ffffffffffffff48);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff20,
                  (value_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff20);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[9]>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00,__args);
    }
  }
  return *(ParseOutput *)(in_RDI + 0x364);
}

Assistant:

ParseOutput helics_parse(Args&&... args) noexcept
    {
        try {
            parse(std::forward<Args>(args)...);
            last_output = ParseOutput::OK;
            remArgs = remaining_for_passthrough();
            if (passConfig) {
                auto* opt = get_option_no_throw("--config");
                if (opt != nullptr && opt->count() > 0) {
                    remArgs.push_back(opt->as<std::string>());
                    remArgs.emplace_back("--config");
                }
            }
        }
        catch (const CLI::CallForHelp& ch) {
            if (!quiet) {
                exit(ch);
            }
            last_output = ParseOutput::HELP_CALL;
        }
        catch (const CLI::CallForAllHelp& ca) {
            if (!quiet) {
                exit(ca);
            }
            last_output = ParseOutput::HELP_ALL_CALL;
        }
        catch (const CLI::CallForVersion& cv) {
            if (!quiet) {
                exit(cv);
            }
            last_output = ParseOutput::VERSION_CALL;
        }
        catch (const CLI::Success& /*sc*/) {
            last_output = ParseOutput::SUCCESS_TERMINATION;
        }
        catch (const CLI::Error& ce) {
            CLI::App::exit(ce);
            last_output = ParseOutput::PARSE_ERROR;
        }
        catch (...) {
            last_output = ParseOutput::PARSE_ERROR;
        }
        return last_output;
    }